

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

Variable LiteScript::CreateVariable(Memory *memory,int count,Variable *values)

{
  void *pvVar1;
  Object *pOVar2;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  Variable VVar5;
  Variable local_40;
  
  Memory::Create(memory,(Type *)CONCAT44(in_register_00000034,count));
  pOVar2 = Variable::operator->((Variable *)memory);
  puVar3 = extraout_RDX;
  if ((int)values != 0) {
    pvVar1 = pOVar2->data;
    uVar4 = 0;
    do {
      Array::operator[]((Array *)&stack0xffffffffffffffb0,(uint)pvVar1);
      Variable::operator=(&local_40,(Variable *)&stack0xffffffffffffffb0);
      Variable::~Variable(&local_40);
      Variable::~Variable((Variable *)&stack0xffffffffffffffb0);
      uVar4 = uVar4 + 1;
      puVar3 = extraout_RDX_00;
    } while (((ulong)values & 0xffffffff) != uVar4);
  }
  VVar5.nb_ref = puVar3;
  VVar5.obj = (Object *)memory;
  return VVar5;
}

Assistant:

LiteScript::Variable LiteScript::CreateVariable(Memory &memory, int count, const Variable *values) {
    Variable v = memory.Create(Type::ARRAY);
    Array& a = v->GetData<Array>();
    for (unsigned int i = 0, sz = (unsigned int)count; i < sz; i++)
        a[i] = values[i];
    return v;
}